

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_dpb.c
# Opt level: O0

RK_S32 get_pic_num_x(H264_StorePic_t *p,RK_S32 difference_of_pic_nums_minus1)

{
  RK_U32 local_18;
  RK_S32 currPicNum;
  RK_S32 difference_of_pic_nums_minus1_local;
  H264_StorePic_t *p_local;
  
  if (p->structure == 3) {
    local_18 = p->frame_num;
  }
  else {
    local_18 = p->frame_num * 2 + 1;
  }
  return local_18 - (difference_of_pic_nums_minus1 + 1);
}

Assistant:

static RK_S32 get_pic_num_x(H264_StorePic_t *p, RK_S32 difference_of_pic_nums_minus1)
{
    RK_S32 currPicNum;

    if (p->structure == FRAME)
        currPicNum = p->frame_num;
    else
        currPicNum = 2 * p->frame_num + 1;

    return currPicNum - (difference_of_pic_nums_minus1 + 1);
}